

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createGEP(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Value *ptr;
  char cVar1;
  uint numBits;
  uint uVar2;
  DataLayout *DL;
  APInt *pAVar3;
  raw_ostream *prVar4;
  uint64_t uVar5;
  PSNode *node;
  PSNodesSeq *pPVar6;
  APInt offset;
  PSNode *op;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  PSNode *local_30;
  anon_union_8_2_1313ab2f_for_U local_28;
  
  ptr = *(Value **)(Inst + -(ulong)(uint)(*(int *)(Inst + 0x14) << 5));
  DL = (DataLayout *)llvm::Module::getDataLayout();
  numBits = llvmutils::getPointerBitwidth(DL,ptr);
  llvm::APInt::APInt((APInt *)&local_40,numBits,0,false);
  local_30 = getOperand(this,ptr);
  if (*(long *)(this + 0xf8) != 0) {
    pAVar3 = (APInt *)llvm::Module::getDataLayout();
    cVar1 = llvm::GetElementPtrInst::accumulateConstantOffset((DataLayout *)Inst,pAVar3);
    if (cVar1 != '\0') {
      uVar2 = llvm::APInt::getActiveBits((APInt *)&local_40);
      if (numBits < uVar2) {
        prVar4 = (raw_ostream *)llvm::errs();
        prVar4 = llvm::raw_ostream::operator<<(prVar4,"WARN: GEP offset greater than ");
        prVar4 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar4,(ulong)numBits);
        llvm::raw_ostream::operator<<(prVar4,"-bit");
      }
      else {
        uVar5 = llvm::APInt::getLimitedValue((APInt *)&local_40,*(uint64_t *)(this + 0xf8));
        if ((uVar5 == 0) || (uVar5 < *(ulong *)(this + 0xf8))) {
          local_28.pVal = (uint64_t *)&local_40;
          if (0x40 < local_38) {
            local_28 = local_40;
          }
          local_28 = (anon_union_8_2_1313ab2f_for_U)*local_28.pVal;
          node = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long>
                           ((PointerGraph *)this,&local_30,&local_28.VAL);
          if (node != (PSNode *)0x0) goto LAB_0012e9e6;
        }
      }
    }
  }
  node = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                   ((PointerGraph *)this,&local_30,&Offset::UNKNOWN);
LAB_0012e9e6:
  pPVar6 = addNode(this,(Value *)Inst,node);
  llvm::APInt::~APInt((APInt *)&local_40);
  return pPVar6;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createGEP(const llvm::Instruction *Inst) {
    using namespace llvm;

    const GetElementPtrInst *GEP = cast<GetElementPtrInst>(Inst);
    const Value *ptrOp = GEP->getPointerOperand();
    unsigned bitwidth =
            llvmutils::getPointerBitwidth(&M->getDataLayout(), ptrOp);
    APInt offset(bitwidth, 0);

    PSNode *node = nullptr;
    PSNode *op = getOperand(ptrOp);

    if (*_options.fieldSensitivity > 0 &&
        GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        // is offset in given bitwidth?
        if (offset.isIntN(bitwidth)) {
            // is 0 < offset < field_sensitivity ?
            uint64_t off = offset.getLimitedValue(*_options.fieldSensitivity);
            if (off == 0 || off < *_options.fieldSensitivity)
                node = PS.create<PSNodeType::GEP>(op, offset.getZExtValue());
        } else
            errs() << "WARN: GEP offset greater than " << bitwidth << "-bit";
        // fall-through to Offset::UNKNOWN in this case
    }

    // we didn't create the node with concrete offset,
    // in which case we are supposed to create a node
    // with Offset::UNKNOWN
    if (!node)
        node = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);

    assert(node);

    return addNode(Inst, node);
}